

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O2

void Fra_ClauMinimizeClause(Cla_Man_t *p,Vec_Int_t *vBasis,Vec_Int_t *vExtra)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  
  i = vExtra->nSize;
  iVar1 = i;
  while (iVar1 = iVar1 + -1, 0 < i) {
    i = i + -1;
    Vec_IntEntry(vExtra,i);
    vBasis->nSize = 0;
    for (iVar3 = 0; iVar3 < vExtra->nSize; iVar3 = iVar3 + 1) {
      iVar2 = Vec_IntEntry(vExtra,iVar3);
      if (iVar1 != iVar3) {
        Vec_IntPush(vBasis,iVar2);
      }
    }
    iVar2 = Fra_ClauCheckClause(p,vBasis,(Vec_Int_t *)0x0);
    iVar3 = i;
    if (iVar2 != 0) {
      while (iVar2 = vExtra->nSize + -1, iVar3 < iVar2) {
        iVar2 = Vec_IntEntry(vExtra,iVar3 + 1);
        Vec_IntWriteEntry(vExtra,iVar3,iVar2);
        iVar3 = iVar3 + 1;
      }
      Vec_IntShrink(vExtra,iVar2);
    }
  }
  return;
}

Assistant:

void Fra_ClauMinimizeClause( Cla_Man_t * p, Vec_Int_t * vBasis, Vec_Int_t * vExtra )
{
    int iLit, iLit2, i, k;
    Vec_IntForEachEntryReverse( vExtra, iLit, i )
    {
        // copy literals without the given one
        Vec_IntClear( vBasis );
        Vec_IntForEachEntry( vExtra, iLit2, k )
            if ( k != i )
                Vec_IntPush( vBasis, iLit2 );
        // try whether it is inductive
        if ( !Fra_ClauCheckClause( p, vBasis, NULL ) )
            continue;
        // the clause is inductive
        // remove the literal
        for ( k = i; k < Vec_IntSize(vExtra)-1; k++ )
            Vec_IntWriteEntry( vExtra, k, Vec_IntEntry(vExtra,k+1) );
        Vec_IntShrink( vExtra, Vec_IntSize(vExtra)-1 );
    }
}